

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operats.c
# Opt level: O1

Vector * OrthoRightKer_VQ(Vector *V,QMatrix *Q)

{
  ulong uVar1;
  Real *pRVar2;
  Real *pRVar3;
  LASErrIdType LVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  Vector *pVVar8;
  double dVar9;
  undefined1 auVar10 [16];
  
  V_Lock(V);
  LVar4 = LASResult();
  if (LVar4 == LASOK) {
    pVVar8 = V;
    if ((Q->UnitRightKer == False) && (Q->RightKerCmp == (Real *)0x0)) goto LAB_0010dc03;
    if (V->Instance == Normal) {
      uVar1 = V->Dim;
      if (uVar1 == Q->Dim) {
        pRVar2 = V->Cmp;
        if (Q->UnitRightKer == False) {
          pRVar3 = Q->RightKerCmp;
          if (uVar1 == 0) {
            dVar9 = 0.0;
          }
          else {
            uVar7 = 1;
            dVar9 = 0.0;
            do {
              dVar9 = dVar9 + pRVar2[uVar7] * pRVar3[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar7 <= uVar1);
          }
          if (uVar1 != 0) {
            uVar7 = 1;
            do {
              pRVar2[uVar7] = pRVar3[uVar7] * -dVar9 + pRVar2[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar7 <= uVar1);
          }
        }
        else {
          if (uVar1 == 0) {
            dVar9 = 0.0;
          }
          else {
            uVar7 = 1;
            dVar9 = 0.0;
            do {
              dVar9 = dVar9 + pRVar2[uVar7];
              uVar7 = uVar7 + 1;
            } while (uVar7 <= uVar1);
          }
          if (uVar1 != 0) {
            auVar10._8_4_ = (int)(uVar1 >> 0x20);
            auVar10._0_8_ = uVar1;
            auVar10._12_4_ = 0x45300000;
            uVar7 = 1;
            do {
              pRVar2[uVar7] =
                   pRVar2[uVar7] -
                   dVar9 / ((auVar10._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
              uVar7 = uVar7 + 1;
            } while (uVar7 <= uVar1);
          }
        }
        goto LAB_0010dc03;
      }
    }
    else {
      pcVar5 = V_GetName(V);
      pcVar6 = Q_GetName(Q);
      LASError(LASLValErr,"OrthoRightKer_VQ",pcVar5,pcVar6,(char *)0x0);
    }
    if (V->Dim != Q->Dim) {
      pcVar5 = V_GetName(V);
      pcVar6 = Q_GetName(Q);
      LASError(LASDimErr,"OrthoRightKer_VQ",pcVar5,pcVar6,(char *)0x0);
      pVVar8 = (Vector *)0x0;
      goto LAB_0010dc03;
    }
  }
  pVVar8 = (Vector *)0x0;
LAB_0010dc03:
  V_Unlock(V);
  return pVVar8;
}

Assistant:

Vector *OrthoRightKer_VQ(Vector *V, QMatrix *Q)
/* orthogonalize vector V to the "right" null space of matrix Q */
{
    Vector *VRes;

    double Sum, Mean;
    size_t Dim, Ind;
    Real *VCmp, *KerCmp;

    V_Lock(V);
    
    if (LASResult() == LASOK) {
        if (Q->UnitRightKer || Q->RightKerCmp != NULL) {
            if (V->Instance == Normal && V->Dim == Q->Dim) {
                Dim = V->Dim;
                VCmp = V->Cmp;
                KerCmp = Q->RightKerCmp;
            
                if (Q->UnitRightKer) {
                    Sum = 0.0;
                       for_AllCmp 
                        Sum += VCmp[Ind];
                        Mean = Sum / (double)Dim;
                       for_AllCmp 
                        VCmp[Ind] -= Mean;
                } else {
                    Sum = 0.0;
                       for_AllCmp
                        Sum += VCmp[Ind] * KerCmp[Ind];
                       for_AllCmp 
                        VCmp[Ind] -= Sum * KerCmp[Ind];
                    }           
                       
                VRes = V;
            } else {
                if (V->Instance != Normal) 
                    LASError(LASLValErr, "OrthoRightKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                if (V->Dim != Q->Dim) 
                    LASError(LASDimErr, "OrthoRightKer_VQ", V_GetName(V), Q_GetName(Q), NULL);
                VRes = NULL;
            }
        } else {
            VRes = V;
        }
    } else {
        VRes = NULL;
    }

    V_Unlock(V);

    return(VRes);
}